

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

ConstPixelBufferAccess * __thiscall
vkt::Draw::Image::readVolume
          (ConstPixelBufferAccess *__return_storage_ptr__,Image *this,VkQueue queue,
          Allocator *allocator,VkImageLayout layout,VkOffset3D offset,int width,int height,int depth
          ,VkImageAspectFlagBits aspect,uint mipLevel,uint arrayElement)

{
  VkOffset3D offset_00;
  VkImageLayout VVar1;
  Allocator *pAVar2;
  Allocator *pAVar3;
  int iVar4;
  uchar *puVar5;
  size_type numBytes;
  TextureFormat local_98;
  VkOffset3D local_90;
  VkOffset3D local_80;
  VkOffset3D local_74;
  VkOffset3D local_64;
  TextureFormat local_58;
  int local_50;
  VkImageLayout local_4c;
  int width_local;
  VkImageLayout layout_local;
  Allocator *allocator_local;
  VkQueue queue_local;
  Image *this_local;
  
  local_50 = width;
  local_4c = layout;
  _width_local = allocator;
  allocator_local = (Allocator *)queue;
  queue_local = (VkQueue)this;
  this_local = (Image *)__return_storage_ptr__;
  local_58 = ::vk::mapVkFormat(this->m_format);
  iVar4 = tcu::TextureFormat::getPixelSize(&local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_pixelAccessData,(long)(width * height * depth * iVar4));
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_pixelAccessData);
  numBytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&this->m_pixelAccessData);
  ::deMemset(puVar5,0,numBytes);
  pAVar3 = allocator_local;
  pAVar2 = _width_local;
  VVar1 = local_4c;
  if (aspect == VK_IMAGE_ASPECT_COLOR_BIT) {
    local_64.x = offset.x;
    local_64.y = offset.y;
    local_64.z = offset.z;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_pixelAccessData);
    local_74.x = local_64.x;
    local_74.y = local_64.y;
    local_74.z = local_64.z;
    read(this,(int)pAVar3,pAVar2,(ulong)VVar1);
  }
  pAVar3 = allocator_local;
  pAVar2 = _width_local;
  VVar1 = local_4c;
  iVar4 = local_50;
  if ((aspect == VK_IMAGE_ASPECT_DEPTH_BIT) || (aspect == VK_IMAGE_ASPECT_STENCIL_BIT)) {
    local_80.x = offset.x;
    local_80.y = offset.y;
    local_80.z = offset.z;
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (&this->m_pixelAccessData);
    local_90.x = local_80.x;
    local_90.y = local_80.y;
    local_90.z = local_80.z;
    offset_00.z = local_80.z;
    offset_00.x = local_80.x;
    offset_00.y = local_80.y;
    readUsingBuffer(this,(VkQueue)pAVar3,pAVar2,VVar1,offset_00,iVar4,height,depth,mipLevel,
                    arrayElement,aspect,puVar5);
  }
  local_98 = ::vk::mapVkFormat(this->m_format);
  iVar4 = local_50;
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_pixelAccessData);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&local_98,iVar4,height,depth,puVar5);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess Image::readVolume (vk::VkQueue					queue,
											   vk::Allocator&				allocator,
											   vk::VkImageLayout			layout,
											   vk::VkOffset3D				offset,
											   int							width,
											   int							height,
											   int							depth,
											   vk::VkImageAspectFlagBits	aspect,
											   unsigned int					mipLevel,
											   unsigned int					arrayElement)
{
	m_pixelAccessData.resize(width * height * depth * vk::mapVkFormat(m_format).getPixelSize());
	deMemset(m_pixelAccessData.data(), 0, m_pixelAccessData.size());
	if (aspect == vk::VK_IMAGE_ASPECT_COLOR_BIT)
	{
		read(queue, allocator, layout, offset, width, height, depth, mipLevel, arrayElement, aspect, vk::VK_IMAGE_TYPE_3D,
		m_pixelAccessData.data());
	}
	if (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT || aspect == vk::VK_IMAGE_ASPECT_STENCIL_BIT)
	{
		readUsingBuffer(queue, allocator, layout, offset, width, height, depth, mipLevel, arrayElement, aspect, m_pixelAccessData.data());
	}
	return tcu::ConstPixelBufferAccess(vk::mapVkFormat(m_format), width, height, depth, m_pixelAccessData.data());
}